

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::PrimitiveTypeHelper<13>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  bool bVar1;
  uint uVar2;
  byte *pbVar3;
  byte *ptr_00;
  uint uVar4;
  
  uVar4 = *ptr;
  ptr_00 = output->cur_;
  if ((output->impl_).end_ <= ptr_00) {
    ptr_00 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,ptr_00);
  }
  output->cur_ = ptr_00;
  *ptr_00 = (byte)uVar4;
  if (uVar4 < 0x80) {
    pbVar3 = ptr_00 + 1;
  }
  else {
    *ptr_00 = (byte)uVar4 | 0x80;
    ptr_00[1] = (byte)(uVar4 >> 7);
    pbVar3 = ptr_00 + 2;
    if (0x3fff < uVar4) {
      uVar2 = (uint)ptr_00[1];
      uVar4 = uVar4 >> 7;
      do {
        pbVar3[-1] = (byte)uVar2 | 0x80;
        uVar2 = uVar4 >> 7;
        *pbVar3 = (byte)uVar2;
        pbVar3 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar4;
        uVar4 = uVar2;
      } while (bVar1);
    }
  }
  output->cur_ = pbVar3;
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    WireFormatLite::WriteUInt32NoTag(Get<uint32_t>(ptr), output);
  }